

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CManageClient.cpp
# Opt level: O3

bool __thiscall CManageClient::IsInWhiteList(CManageClient *this,in_addr_t ip)

{
  bool bVar1;
  ArrayIndex AVar2;
  in_addr_t iVar3;
  Value *pVVar4;
  int i;
  uint index;
  string balst_ip;
  Value allow_ip;
  string local_78;
  Value local_58;
  
  bVar1 = Json::Value::empty(&this->m_Config);
  index = 0;
  if (!bVar1) {
    pVVar4 = Json::Value::operator[](&this->m_Config,"white");
    Json::Value::Value(&local_58,pVVar4);
    do {
      AVar2 = Json::Value::size(&local_58);
      if (AVar2 <= index) {
        Json::Value::~Value(&local_58);
        index = 0;
        goto LAB_0010a78d;
      }
      pVVar4 = Json::Value::operator[](&local_58,index);
      Json::Value::asString_abi_cxx11_(&local_78,pVVar4);
      iVar3 = inet_addr(local_78._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      index = index + 1;
    } while (iVar3 != ip);
    Json::Value::~Value(&local_58);
    index = 1;
  }
LAB_0010a78d:
  return SUB41(index,0);
}

Assistant:

bool CManageClient::IsInWhiteList(in_addr_t ip) const {
    if(!m_Config.empty()){
        Json::Value allow_ip = m_Config["white"];
        for(int i = 0;i < allow_ip.size();i++){
            string balst_ip = allow_ip[i].asString();
            if(ip == inet_addr(balst_ip.c_str())){
                return true;
            }
        }
    }
    return false;
}